

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# epoch_tracker.cc
# Opt level: O3

int16_t * __thiscall
sptk::reaper::EpochTracker::HighpassFilter
          (EpochTracker *this,int16_t *input,int32_t n_input,float sample_rate,float corner_freq,
          float fir_duration)

{
  bool bVar1;
  bool bVar2;
  int nIn;
  bool first;
  int iVar3;
  int iVar4;
  int16_t *piVar5;
  int32_t iVar6;
  ulong uVar7;
  int iVar8;
  int iVar9;
  byte bVar10;
  FdFilter filter;
  FdFilter local_c0;
  
  FdFilter::FdFilter(&local_c0,sample_rate,corner_freq,true,fir_duration,false);
  uVar7 = 0xffffffffffffffff;
  if (-1 < n_input) {
    uVar7 = (ulong)(uint)n_input * 2;
  }
  piVar5 = (int16_t *)operator_new__(uVar7);
  iVar3 = FdFilter::GetMaxInputSize(&local_c0);
  if (0 < n_input) {
    first = true;
    iVar8 = 0;
    iVar9 = 0;
    iVar6 = n_input;
    bVar10 = 0;
    do {
      nIn = iVar3;
      if (iVar6 < iVar3) {
        nIn = iVar6;
      }
      bVar1 = iVar6 <= iVar3;
      iVar4 = FdFilter::FilterArray
                        (&local_c0,input + iVar9,nIn,first,(bool)(bVar1 | bVar10),piVar5 + iVar8,
                         n_input - iVar8);
      iVar9 = iVar9 + nIn;
      iVar8 = iVar8 + iVar4;
      first = false;
      iVar4 = iVar6 - nIn;
      bVar2 = nIn <= iVar6;
      iVar6 = iVar4;
      bVar10 = bVar1 | bVar10;
    } while (iVar4 != 0 && bVar2);
  }
  FdFilter::~FdFilter(&local_c0);
  return piVar5;
}

Assistant:

int16_t* EpochTracker::HighpassFilter(int16_t* input, int32_t n_input,
                                      float sample_rate, float corner_freq,
				      float fir_duration) {
  FdFilter filter(sample_rate, corner_freq, true, fir_duration, false);
  int16_t* filtered_data = new int16_t[n_input];
  int32_t max_buffer_size = filter.GetMaxInputSize();
  int32_t to_process = n_input;
  bool start = true;
  bool end = false;
  int32_t input_index = 0;
  int32_t output_index = 0;
  while (to_process > 0) {
    int32_t to_send = to_process;
    if (to_send > max_buffer_size) {
      to_send = max_buffer_size;
    } else {
      end = true;
    }
    int32_t samples_returned = filter.FilterArray(input + input_index, to_send,
                                                  start, end,
                                                  filtered_data + output_index,
                                                  n_input - output_index);
    input_index += to_send;
    to_process -= to_send;
    output_index += samples_returned;
    start = false;
  }
  return filtered_data;
}